

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall imrt::Plan::newCopy(Plan *this,Plan *p)

{
  bool bVar1;
  int iVar2;
  Station *this_00;
  mapped_type *ppSVar3;
  long in_RSI;
  long in_RDI;
  Station *in_stack_00000008;
  Station *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<double,_std::allocator<double>_> *in_stack_00000020;
  Station *aux;
  const_iterator it;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_ffffffffffffff78;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_stack_ffffffffffffff80;
  Station *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffbc;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *in_stack_ffffffffffffffc0;
  iterator local_30;
  _List_const_iterator<imrt::Station_*> local_28;
  iterator local_20;
  _List_const_iterator<imrt::Station_*> local_18;
  long local_10;
  
  *(undefined8 *)(in_RDI + 0x58) = 0;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000020,in_stack_00000018);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000020,in_stack_00000018);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000020,in_stack_00000018);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::clear
            (in_stack_ffffffffffffff80);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                 (in_stack_ffffffffffffff78);
  std::_List_const_iterator<imrt::Station_*>::_List_const_iterator(&local_18,&local_20);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                   (in_stack_ffffffffffffff78);
    std::_List_const_iterator<imrt::Station_*>::_List_const_iterator(&local_28,&local_30);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    this_00 = (Station *)operator_new(0x170);
    std::_List_const_iterator<imrt::Station_*>::operator*
              ((_List_const_iterator<imrt::Station_*> *)in_stack_ffffffffffffff80);
    Station::Station(in_stack_00000010,in_stack_00000008);
    if (*(long *)(local_10 + 0x58) != 0) {
      in_stack_ffffffffffffff94 = Station::getAngle(*(Station **)(local_10 + 0x58));
      iVar2 = Station::getAngle(this_00);
      if (in_stack_ffffffffffffff94 == iVar2) {
        *(Station **)(in_RDI + 0x58) = this_00;
      }
    }
    std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::push_back
              ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (value_type *)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff80 =
         (list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)(in_RDI + 8);
    iVar2 = Station::getAngle(this_00);
    ppSVar3 = std::
              map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
              ::operator[](in_stack_ffffffffffffffc0,
                           (key_type_conflict *)CONCAT44(in_stack_ffffffffffffffbc,iVar2));
    *ppSVar3 = this_00;
    std::_List_const_iterator<imrt::Station_*>::operator++(&local_18,0);
    in_stack_ffffffffffffff88 = this_00;
  }
  *(undefined8 *)(in_RDI + 200) = *(undefined8 *)(local_10 + 200);
  return;
}

Assistant:

void Plan::newCopy(Plan& p) {
    last_changed=NULL;
    //ev= EvaluationFunction::getInstance();

    w=p.w;
    Zmin=p.Zmin;
    Zmax=p.Zmax;
    stations.clear();
    //real_stations.clear();
    for (list<Station*>::const_iterator it=p.stations.begin();it!=p.stations.end();it++) {
      Station* aux = new Station (**it);
      if (p.last_changed!=NULL && p.last_changed->getAngle()==aux->getAngle()) last_changed=aux;
      stations.push_back(aux);
      angle2station[aux->getAngle()]=aux;
      //real_stations.push_back(*aux);
    }
    evaluation_fx=p.evaluation_fx;
  }